

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_multiply_n(mat4 *__return_storage_ptr__,int count,...)

{
  int iVar1;
  float (*pafVar2) [16];
  bool bVar3;
  va_list args;
  
  __return_storage_ptr__->m[0] = 1.0;
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 1.0;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  pafVar2 = (float (*) [16])&stack0x00000008;
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  while( true ) {
    bVar3 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar3) break;
    mat4_multiply(*(mat4 *)__return_storage_ptr__->m,(mat4)*pafVar2);
    pafVar2 = pafVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_multiply_n(int count, ...) {
    va_list args;
    va_start(args, count);
    mat4 result = mat4_identity();
    for (int i = 0; i < count; i++) {
        result = mat4_multiply(result, va_arg(args, mat4));
    }
    va_end(args);
    return result;
}